

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O2

bool ApprovalTests::CIBuildOnlyReporter::isRunningUnderCI(void)

{
  size_type sVar1;
  long lVar2;
  long lVar3;
  char *in_RDX;
  char *extraout_RDX;
  string local_40;
  
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (lVar3 == 0x38) break;
    SystemUtils::safeGetEnv_abi_cxx11_
              (&local_40,*(SystemUtils **)((long)&PTR_anon_var_dwarf_e1c16_0016af70 + lVar3),in_RDX)
    ;
    sVar1 = local_40._M_string_length;
    ::std::__cxx11::string::~string((string *)&local_40);
    lVar2 = lVar3 + 8;
    in_RDX = extraout_RDX;
  } while (sVar1 == 0);
  return lVar3 != 0x38;
}

Assistant:

bool CIBuildOnlyReporter::isRunningUnderCI()
    {
        /*
        auto AppVeyor = {"CI", "APPVEYOR"}; // https://www.appveyor.com/docs/environment-variables/
        auto AzurePipelines = {"TF_BUILD"}; // https://docs.microsoft.com/en-us/azure/devops/pipelines/build/variables?view=azure-devops&viewFallbackFrom=vsts&tabs=yaml
        auto GitHubActions = {"GITHUB_ACTIONS"}; // https://help.github.com/en/actions/configuring-and-managing-workflows/using-environment-variables
        auto GoCD = {"GO_SERVER_URL"}: // https://docs.gocd.org/current/faq/dev_use_current_revision_in_build.html
        auto Jenkins = {"JENKINS_URL"}: // https://wiki.jenkins.io/display/JENKINS/Building+a+software+project
        auto TeamCity = {"TEAMCITY_VERSION"}; // https://confluence.jetbrains.com/display/TCD18/Predefined+Build+Parameters
        auto Travis = {"CI", "TRAVIS", "CONTINUOUS_INTEGRATION"}; // https://docs.travis-ci.com/user/environment-variables/#default-environment-variables
        auto environmentVariablesForCI = combine({
            // begin-snippet: supported_ci_systems
            AppVeyor,
            AzurePipelines,
            GitHubActions,
            GoCD
            Jenkins,
            TeamCity,
            Travis,
            // end-snippet
        });
         */
        auto environmentVariablesForCI = {
            // begin-snippet: supported_ci_env_vars
            "CI",
            "CONTINUOUS_INTEGRATION",
            "GITHUB_ACTIONS",
            "GO_SERVER_URL",
            "JENKINS_URL",
            "TEAMCITY_VERSION",
            "TF_BUILD"
            // end-snippet
        };
        for (const auto& variable : environmentVariablesForCI)
        {
            if (!SystemUtils::safeGetEnv(variable).empty())
            {
                return true;
            }
        }
        return false;
    }